

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_section.hpp
# Opt level: O0

void __thiscall
pstore::repo::generic_section::
generic_section<std::pair<pstore::pointer_based_iterator<unsigned_char_const>,pstore::pointer_based_iterator<unsigned_char_const>>,std::pair<__gnu_cxx::__normal_iterator<pstore::repo::internal_fixup_const*,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>,__gnu_cxx::__normal_iterator<pstore::repo::internal_fixup_const*,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>>,std::pair<__gnu_cxx::__normal_iterator<pstore::repo::external_fixup_const*,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>,__gnu_cxx::__normal_iterator<pstore::repo::external_fixup_const*,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>>>
          (generic_section *this,
          pair<pstore::pointer_based_iterator<const_unsigned_char>,_pstore::pointer_based_iterator<const_unsigned_char>_>
          *d,pair<__gnu_cxx::__normal_iterator<const_pstore::repo::internal_fixup_*,_std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_>,___gnu_cxx::__normal_iterator<const_pstore::repo::internal_fixup_*,_std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_>_>
             *i,pair<__gnu_cxx::__normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>,___gnu_cxx::__normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>_>
                *x,uint8_t align)

{
  __normal_iterator<const_pstore::repo::internal_fixup_*,_std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_>
  __first;
  __normal_iterator<const_pstore::repo::internal_fixup_*,_std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_>
  __last;
  __normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>
  __first_00;
  __normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>
  __last_00;
  bool bVar1;
  uint uVar2;
  unsigned_long uVar3;
  internal_fixup *__result;
  external_fixup *__result_00;
  size_t sVar4;
  external_fixup *local_40;
  uint8_t *p;
  uint8_t *start;
  uint8_t align_local;
  pair<__gnu_cxx::__normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>,___gnu_cxx::__normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>_>
  *x_local;
  pair<__gnu_cxx::__normal_iterator<const_pstore::repo::internal_fixup_*,_std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_>,___gnu_cxx::__normal_iterator<const_pstore::repo::internal_fixup_*,_std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_>_>
  *i_local;
  pair<pstore::pointer_based_iterator<const_unsigned_char>,_pstore::pointer_based_iterator<const_unsigned_char>_>
  *d_local;
  generic_section *this_local;
  
  (this->field_0).field32_ = 0;
  this->num_xfixups_ = 0;
  this->data_size_ = 0;
  uVar2 = bit_count::ctz((ulong)align);
  bit_field<unsigned_int,0u,8u>::operator=((bit_field<unsigned_int,0u,8u> *)this,uVar2);
  bit_field<unsigned_int,8u,24u>::operator=((bit_field<unsigned_int,8u,24u> *)this,0);
  local_40 = (external_fixup *)(this + 1);
  uVar2 = bit_count::pop_count(align);
  if (uVar2 != 1) {
    assert_failed("bit_count::pop_count (align) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/mcrepo/generic_section.hpp"
                  ,0x14a);
  }
  bVar1 = pointer_based_iterator<unsigned_char_const>::operator!=
                    ((pointer_based_iterator<unsigned_char_const> *)d,&d->second);
  if (bVar1) {
    uVar3 = set_size<unsigned_long,pstore::pointer_based_iterator<unsigned_char_const>,void>
                      ((pointer_based_iterator<const_unsigned_char>)(d->first).pos_,
                       (pointer_based_iterator<const_unsigned_char>)(d->second).pos_);
    this->data_size_ = uVar3;
    local_40 = (external_fixup *)
               std::
               uninitialized_copy<pstore::pointer_based_iterator<unsigned_char_const>,unsigned_char*>
                         ((pointer_based_iterator<const_unsigned_char>)(d->first).pos_,
                          (pointer_based_iterator<const_unsigned_char>)(d->second).pos_,
                          (uchar *)local_40);
  }
  bVar1 = __gnu_cxx::operator!=(&i->first,&i->second);
  if (bVar1) {
    __first._M_current = (i->first)._M_current;
    __last._M_current = (i->second)._M_current;
    __result = aligned_ptr<pstore::repo::internal_fixup,unsigned_char>((uchar *)local_40);
    local_40 = (external_fixup *)
               std::
               uninitialized_copy<__gnu_cxx::__normal_iterator<pstore::repo::internal_fixup_const*,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>,pstore::repo::internal_fixup*>
                         (__first,__last,__result);
    uVar2 = set_size<unsigned_int,__gnu_cxx::__normal_iterator<pstore::repo::internal_fixup_const*,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>,void>
                      ((i->first)._M_current,(i->second)._M_current);
    bit_field<unsigned_int,8u,24u>::operator=((bit_field<unsigned_int,8u,24u> *)this,uVar2);
  }
  bVar1 = __gnu_cxx::operator!=(&x->first,&x->second);
  if (bVar1) {
    __first_00._M_current = (x->first)._M_current;
    __last_00._M_current = (x->second)._M_current;
    __result_00 = aligned_ptr<pstore::repo::external_fixup,unsigned_char>((uchar *)local_40);
    local_40 = std::
               uninitialized_copy<__gnu_cxx::__normal_iterator<pstore::repo::external_fixup_const*,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>,pstore::repo::external_fixup*>
                         (__first_00,__last_00,__result_00);
    uVar2 = set_size<unsigned_int,__gnu_cxx::__normal_iterator<pstore::repo::external_fixup_const*,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>,void>
                      ((x->first)._M_current,(x->second)._M_current);
    this->num_xfixups_ = uVar2;
  }
  if ((this <= local_40) &&
     (sVar4 = size_bytes<std::pair<pstore::pointer_based_iterator<unsigned_char_const>,pstore::pointer_based_iterator<unsigned_char_const>>,std::pair<__gnu_cxx::__normal_iterator<pstore::repo::internal_fixup_const*,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>,__gnu_cxx::__normal_iterator<pstore::repo::internal_fixup_const*,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>>,std::pair<__gnu_cxx::__normal_iterator<pstore::repo::external_fixup_const*,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>,__gnu_cxx::__normal_iterator<pstore::repo::external_fixup_const*,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>>>
                        (d,i,x), (long)local_40 - (long)this == sVar4)) {
    return;
  }
  assert_failed("p >= start && static_cast<std::size_t> (p - start) == size_bytes (d, i, x)",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/mcrepo/generic_section.hpp"
                ,0x15d);
}

Assistant:

generic_section::generic_section (DataRange const & d, IFixupRange const & i,
                                          XFixupRange const & x, std::uint8_t const align) {
            align_ = bit_count::ctz (align);
            num_ifixups_ = std::uint32_t{0};

            PSTORE_STATIC_ASSERT (std::is_standard_layout<generic_section>::value);

            PSTORE_STATIC_ASSERT (offsetof (generic_section, field32_) == 0);
            PSTORE_STATIC_ASSERT (offsetof (generic_section, align_) ==
                                  offsetof (generic_section, field32_));
            PSTORE_STATIC_ASSERT (offsetof (generic_section, num_ifixups_) ==
                                  offsetof (generic_section, field32_));

            PSTORE_STATIC_ASSERT (offsetof (generic_section, num_xfixups_) == 4);
            PSTORE_STATIC_ASSERT (offsetof (generic_section, data_size_) == 8);
            PSTORE_STATIC_ASSERT (sizeof (generic_section) == 16);
            PSTORE_STATIC_ASSERT (alignof (generic_section) == 8);
#ifndef NDEBUG
            auto * const start = reinterpret_cast<std::uint8_t const *> (this);
#endif
            // Note that the memory pointed to by 'p' is uninitialized.
            auto * p = reinterpret_cast<std::uint8_t *> (this + 1);
            PSTORE_ASSERT (bit_count::pop_count (align) == 1);

            if (d.first != d.second) {
                data_size_ = generic_section::set_size<decltype (data_size_)> (d.first, d.second);
                p = std::uninitialized_copy (d.first, d.second, p);
            }
            if (i.first != i.second) {
                p = reinterpret_cast<std::uint8_t *> (
                    std::uninitialized_copy (i.first, i.second, aligned_ptr<internal_fixup> (p)));
                num_ifixups_ = generic_section::set_size<decltype (num_ifixups_)::value_type> (
                    i.first, i.second);
            }
            if (x.first != x.second) {
                p = reinterpret_cast<std::uint8_t *> (
                    std::uninitialized_copy (x.first, x.second, aligned_ptr<external_fixup> (p)));
                num_xfixups_ =
                    generic_section::set_size<decltype (num_xfixups_)> (x.first, x.second);
            }
            PSTORE_ASSERT (p >= start &&
                           static_cast<std::size_t> (p - start) == size_bytes (d, i, x));
        }